

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O1

void __thiscall
soplex::SPxVectorST<double>::setupWeights(SPxVectorST<double> *this,SPxSolverBase<double> *base)

{
  Item *pIVar1;
  int iVar2;
  bool *pbVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  Item *pIVar9;
  DataKey *pDVar10;
  long lVar11;
  bool bVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  Real RVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  if (this->state == DVEC) {
    pdVar4 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    lVar11 = (long)iVar2;
    if (iVar2 != (int)((ulong)((long)(this->vec).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4) >> 3))
    goto LAB_0020a911;
    if (iVar2 != 0) {
      pdVar5 = (this->super_SPxWeightST<double>).rowWeight.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      do {
        pdVar5[lVar11 + -1] = ABS(pdVar4[lVar11 + -1]) + pdVar5[lVar11 + -1];
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    lVar11 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (lVar11 != 0) {
      pIVar9 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.theitem;
      pDVar10 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.thekey;
      pdVar5 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar6 = (this->super_SPxWeightST<double>).colWeight.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      do {
        iVar2 = pDVar10[lVar11 + -1].idx;
        lVar14 = (long)pIVar9[iVar2].data.super_SVectorBase<double>.memused;
        if (lVar14 == 0) {
          dVar17 = 0.0;
          dVar18 = 0.0;
        }
        else {
          piVar13 = &pIVar9[iVar2].data.super_SVectorBase<double>.m_elem[lVar14 + -1].idx;
          dVar17 = 0.0;
          dVar18 = 0.0;
          do {
            iVar2 = *piVar13;
            dVar20 = ((Nonzero<double> *)(piVar13 + -2))->val;
            piVar13 = piVar13 + -4;
            dVar17 = dVar17 + dVar20 * pdVar4[iVar2];
            dVar18 = dVar18 + dVar20 * dVar20;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        lVar11 = lVar11 + -1;
        if (0.0 < dVar18) {
          pdVar6[lVar11] = ABS(dVar17 / dVar18 - pdVar5[lVar11]) + pdVar6[lVar11];
        }
      } while (lVar11 != 0);
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
        thenum != (int)((ulong)((long)(this->vec).val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->vec).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3))) {
LAB_0020a911:
      SPxWeightST<double>::setupWeights(&this->super_SPxWeightST<double>,base);
      return;
    }
    RVar16 = Tolerances::epsilon((base->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    dVar17 = RVar16 * 10000.0;
    lVar11 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (lVar11 != 0) {
      pbVar3 = (this->super_SPxWeightST<double>).colUp.data;
      pdVar4 = (this->super_SPxWeightST<double>).colWeight.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar5 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar7 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar8 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar14 = 0;
      do {
        dVar18 = pdVar5[lVar11 + lVar14 + -1];
        dVar20 = pdVar7[lVar11 + lVar14 + -1] - dVar18;
        dVar18 = dVar18 - pdVar6[lVar11 + lVar14 + -1];
        if (dVar20 <= dVar18) {
          dVar19 = pdVar8[lVar11 + lVar14 + -1] * dVar17 - dVar20;
        }
        else {
          dVar19 = -dVar18 - pdVar8[lVar11 + lVar14 + -1] * dVar17;
        }
        pdVar4[lVar11 + lVar14 + -1] = dVar19;
        pbVar3[lVar14 + lVar11 + -1] = dVar20 <= dVar18;
        lVar14 = lVar14 + -1;
      } while (-lVar14 != lVar11);
    }
    lVar11 = (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (lVar11 != 0) {
      pIVar9 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.theitem;
      pDVar10 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thekey;
      pdVar4 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar7 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar8 = (this->super_SPxWeightST<double>).rowWeight.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pbVar3 = (this->super_SPxWeightST<double>).rowRight.data;
      do {
        pIVar1 = pIVar9 + pDVar10[lVar11 + -1].idx;
        iVar2 = (pIVar1->data).super_SVectorBase<double>.memused;
        lVar14 = (long)iVar2;
        if (lVar14 < 1) {
          dVar18 = 0.0;
        }
        else {
          lVar15 = lVar14 + 1;
          piVar13 = &(pIVar1->data).super_SVectorBase<double>.m_elem[lVar14 + -1].idx;
          dVar19 = 0.0;
          dVar20 = 0.0;
          do {
            dVar21 = pdVar4[*piVar13] * ((Nonzero<double> *)(piVar13 + -2))->val;
            dVar18 = dVar20 + dVar21;
            dVar19 = dVar19 + (dVar21 - (dVar18 - dVar20)) + (dVar20 - (dVar18 - (dVar18 - dVar20)))
            ;
            lVar15 = lVar15 + -1;
            piVar13 = piVar13 + -4;
            dVar20 = dVar18;
          } while (1 < lVar15);
          dVar18 = dVar18 + dVar19;
        }
        lVar11 = lVar11 + -1;
        dVar20 = dVar18 - pdVar5[lVar11];
        dVar18 = pdVar6[lVar11] - dVar18;
        if (dVar18 <= dVar20) {
          if (iVar2 < 1) {
            dVar20 = 0.0;
          }
          else {
            lVar15 = lVar14 + 1;
            piVar13 = &(pIVar1->data).super_SVectorBase<double>.m_elem[lVar14 + -1].idx;
            dVar21 = 0.0;
            dVar19 = 0.0;
            do {
              dVar22 = pdVar7[*piVar13] * ((Nonzero<double> *)(piVar13 + -2))->val;
              dVar20 = dVar19 + dVar22;
              dVar21 = dVar21 + (dVar22 - (dVar20 - dVar19)) +
                                (dVar19 - (dVar20 - (dVar20 - dVar19)));
              lVar15 = lVar15 + -1;
              piVar13 = piVar13 + -4;
              dVar19 = dVar20;
            } while (1 < lVar15);
            dVar20 = dVar20 + dVar21;
          }
          dVar18 = dVar20 * dVar17 + (-dVar18 - (double)iVar2 * RVar16);
          bVar12 = true;
        }
        else {
          if (iVar2 < 1) {
            dVar18 = 0.0;
          }
          else {
            lVar15 = lVar14 + 1;
            piVar13 = &(pIVar1->data).super_SVectorBase<double>.m_elem[lVar14 + -1].idx;
            dVar21 = 0.0;
            dVar19 = 0.0;
            do {
              dVar22 = pdVar7[*piVar13] * ((Nonzero<double> *)(piVar13 + -2))->val;
              dVar18 = dVar19 + dVar22;
              dVar21 = dVar21 + (dVar22 - (dVar18 - dVar19)) +
                                (dVar19 - (dVar18 - (dVar18 - dVar19)));
              lVar15 = lVar15 + -1;
              piVar13 = piVar13 + -4;
              dVar19 = dVar18;
            } while (1 < lVar15);
            dVar18 = dVar18 + dVar21;
          }
          dVar18 = (-dVar20 - (double)iVar2 * RVar16) - dVar18 * dVar17;
          bVar12 = false;
        }
        pdVar8[lVar11] = dVar18;
        pbVar3[lVar11] = bVar12;
      } while (lVar11 != 0);
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}